

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<void(S::*const&)()>::operator==
          (result *__return_storage_ptr__,expression_lhs<void(S::*const&)()> *this,
          offset_in_S_to_subr *rhs)

{
  offset_in_S_to_subr oVar1;
  offset_in_S_to_subr *lhs;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  lest local_90 [32];
  string local_70 [39];
  bool local_49;
  result local_48;
  offset_in_S_to_subr *local_20;
  offset_in_S_to_subr *rhs_local;
  expression_lhs<void_(S::*const_&)()> *this_local;
  
  oVar1 = **(offset_in_S_to_subr **)this;
  local_49 = oVar1 == *rhs && (oVar1 == 0 || (*(offset_in_S_to_subr **)this)[1] == rhs[1]);
  lhs = *(offset_in_S_to_subr **)this;
  local_20 = rhs;
  rhs_local = (offset_in_S_to_subr *)this;
  this_local = (expression_lhs<void_(S::*const_&)()> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"==",&local_d1);
  std::__cxx11::string::string(local_b0,local_d0);
  to_string<void(S::*)(),void(S::*)()>(local_90,lhs,(string *)local_b0,local_20);
  std::__cxx11::string::string(local_70,(string *)local_90);
  result::result<bool>(&local_48,&local_49,(text *)local_70);
  result::result(__return_storage_ptr__,&local_48);
  result::~result(&local_48);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }